

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall Imf_3_4::anon_unknown_0::LineCompositeTask::execute(LineCompositeTask *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000001e0;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *in_stack_000001e8;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_000001f0;
  Data *in_stack_000001f8;
  int in_stack_00000200;
  int in_stack_00000204;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000210;
  
  composite_line(in_stack_00000204,in_stack_00000200,in_stack_000001f8,in_stack_000001f0,
                 in_stack_000001e8,in_stack_000001e0,in_stack_00000210);
  return;
}

Assistant:

void
LineCompositeTask::execute ()
{
    composite_line (
        _y, _start, _Data, *_names, *_pointers, *_total_sizes, *_num_sources);
}